

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O2

void * rw::copySkin(void *dst,void *src,int32 offset,int32 param_4)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  Skin *this;
  
  puVar2 = *(uint **)((long)src + (long)offset);
  if (puVar2 != (uint *)0x0) {
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/skin.cpp line: 58"
    ;
    this = (Skin *)(*DAT_00145dd8)(0x70,0x30116);
    *(Skin **)((long)dst + (long)offset) = this;
    uVar1 = *puVar2;
    this->numBones = uVar1;
    uVar3 = puVar2[2];
    this->numUsedBones = puVar2[1];
    this->numWeights = uVar3;
    Skin::init(this,(EVP_PKEY_CTX *)(ulong)uVar1);
    memcpy(this->usedBones,*(void **)(puVar2 + 4),(long)(int)puVar2[1]);
    memcpy(this->inverseMatrices,*(void **)(puVar2 + 6),(long)(int)*puVar2 << 6);
    memcpy(this->indices,*(void **)(puVar2 + 8),(long)*(int *)((long)src + 0x1c) << 2);
    memcpy(this->weights,*(void **)(puVar2 + 10),(long)*(int *)((long)src + 0x1c) << 4);
  }
  return dst;
}

Assistant:

static void*
copySkin(void *dst, void *src, int32 offset, int32)
{
	Skin *srcskin = *PLUGINOFFSET(Skin*, src, offset);
	if(srcskin == nil)
		return dst;
	Geometry *geometry = (Geometry*)src;
	assert(geometry->instData == nil);
	assert(((Geometry*)src)->numVertices == ((Geometry*)dst)->numVertices);
	Skin *dstskin = rwNewT(Skin, 1, MEMDUR_EVENT | ID_SKIN);
	*PLUGINOFFSET(Skin*, dst, offset) = dstskin;
	dstskin->numBones = srcskin->numBones;
	dstskin->numUsedBones = srcskin->numUsedBones;
	dstskin->numWeights = srcskin->numWeights;

	assert(0 && "can't copy skin yet");
	dstskin->init(srcskin->numBones, srcskin->numUsedBones,
	              geometry->numVertices);
	memcpy(dstskin->usedBones, srcskin->usedBones, srcskin->numUsedBones);
	memcpy(dstskin->inverseMatrices, srcskin->inverseMatrices,
	       srcskin->numBones*64);
	memcpy(dstskin->indices, srcskin->indices, geometry->numVertices*4);
	memcpy(dstskin->weights, srcskin->weights, geometry->numVertices*16);
	return dst;
}